

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O1

Curl_dns_entry * Curl_dnscache_get(Curl_easy *data,char *hostname,int port,int ip_version)

{
  Curl_share *pCVar1;
  Curl_dns_entry *pCVar2;
  Curl_dnscache *dnscache;
  
  pCVar1 = data->share;
  if ((pCVar1 == (Curl_share *)0x0) || ((pCVar1->specifier & 8) == 0)) {
    dnscache = &data->multi->dnscache;
    if (data->multi == (Curl_multi *)0x0) {
      dnscache = (Curl_dnscache *)0x0;
    }
  }
  else {
    dnscache = &pCVar1->dnscache;
  }
  if ((pCVar1 != (Curl_share *)0x0) && (&pCVar1->dnscache == dnscache)) {
    Curl_share_lock(data,CURL_LOCK_DATA_DNS,CURL_LOCK_ACCESS_SINGLE);
  }
  pCVar2 = fetch_addr(data,dnscache,hostname,port,ip_version);
  if (pCVar2 != (Curl_dns_entry *)0x0) {
    pCVar2->refcount = pCVar2->refcount + 1;
  }
  if ((data->share != (Curl_share *)0x0) && (&data->share->dnscache == dnscache)) {
    Curl_share_unlock(data,CURL_LOCK_DATA_DNS);
  }
  return pCVar2;
}

Assistant:

struct Curl_dns_entry *
Curl_dnscache_get(struct Curl_easy *data,
                  const char *hostname,
                  int port,
                  int ip_version)
{
  struct Curl_dnscache *dnscache = dnscache_get(data);
  struct Curl_dns_entry *dns = NULL;

  dnscache_lock(data, dnscache);

  dns = fetch_addr(data, dnscache, hostname, port, ip_version);
  if(dns)
    dns->refcount++; /* we use it! */

  dnscache_unlock(data, dnscache);

  return dns;
}